

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_MessageDestroy(hrgls_Message obj)

{
  hrgls_Status s;
  hrgls_Message obj_local;
  
  if (obj == (hrgls_Message)0x0) {
    obj_local._4_4_ = 0x3ec;
  }
  else {
    if (obj != (hrgls_Message)0x0) {
      hrgls_Message_::~hrgls_Message_(obj);
      operator_delete(obj);
    }
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageDestroy(hrgls_Message obj)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_DELETE_OF_NULL_POINTER;
	  }
	  try {
		  delete obj;
	  } catch (...) {
		  s = hrgls_STATUS_DELETION_FAILED;
	  }
	  return s;
  }